

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O1

int get_valid_genders(nh_roles_info *ri,int rolenum,int racenum,int alignnum,nh_listitem *list,
                     int listlen)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (ri->num_genders < 1) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      iVar1 = is_valid_character(ri,rolenum,racenum,(int)lVar3,alignnum);
      if (iVar1 != 0) {
        if (iVar2 < listlen && list != (nh_listitem *)0x0) {
          strcpy(list[iVar2].caption,ri->gendnames[lVar3]);
          list[iVar2].id = (int)lVar3;
        }
        iVar2 = iVar2 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < ri->num_genders);
  }
  return iVar2;
}

Assistant:

static int get_valid_genders(const struct nh_roles_info *ri, int rolenum,
			   int racenum, int alignnum, struct nh_listitem *list, int listlen)
{
    int i;
    int count = 0;
    
    for (i = 0; i < ri->num_genders; i++) {
	if (!is_valid_character(ri, rolenum, racenum, i, alignnum))
	    continue;
	
	if (list && count < listlen) {
	    strcpy(list[count].caption, ri->gendnames[i]);
	    list[count].id = i;
	}
	count++;
    }
    return count;
}